

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListTest_splice_list_move_Test::TestBody(IntrusiveListTest_splice_list_move_Test *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  _func_int **pp_Var3;
  long lVar4;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_01;
  TestObjectList list1;
  int iVar5;
  TestObjectList local_88;
  TestObjectList local_68;
  IntrusiveListTest local_48;
  GTestFlagSaver *local_38;
  
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_88.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_200000001;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 3;
  local_88.first_ = pTVar2;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList
            (&local_68,(IntrusiveListTest *)&local_88,data_values);
  operator_delete(pTVar2);
  pTVar2 = local_68.first_;
  local_38 = (GTestFlagSaver *)0x0;
  local_48.super_Test._vptr_Test = (_func_int **)0x0;
  local_48.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  pp_Var3 = (_func_int **)operator_new(8);
  local_48.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)(pp_Var3 + 1);
  *pp_Var3 = (_func_int *)0xc800000064;
  local_48.super_Test._vptr_Test = pp_Var3;
  local_38 = local_48.super_Test.gtest_flag_saver_.ptr_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList(&local_88,&local_48,data_values_00);
  iVar5 = (int)&local_88;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_68,(int)&local_68,(__off64_t *)pTVar2,iVar5,(__off64_t *)&local_88,
             (size_t)local_88.first_,iVar5);
  pTVar2 = local_88.first_;
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  local_88.size_ = 0;
  operator_delete(pp_Var3);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0x14);
  local_88.last_ = (TestObject *)&pTVar2->data2;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 3;
  local_88.first_ = pTVar2;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,&local_88,expected);
  operator_delete(pTVar2);
  local_38 = (GTestFlagSaver *)0x0;
  local_48.super_Test._vptr_Test = (_func_int **)0x0;
  local_48.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  pp_Var3 = (_func_int **)operator_new(0xc);
  local_48.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)((long)pp_Var3 + 0xc);
  *pp_Var3 = (_func_int *)&DAT_258000001f4;
  *(undefined4 *)(pp_Var3 + 1) = 700;
  local_48.super_Test._vptr_Test = pp_Var3;
  local_38 = local_48.super_Test.gtest_flag_saver_.ptr_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList(&local_88,&local_48,data_values_01);
  iVar5 = (int)&local_88;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_68,(int)&local_68,(__off64_t *)0x0,iVar5,(__off64_t *)&local_88,
             (size_t)local_88.first_,iVar5);
  pTVar2 = local_88.first_;
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  local_88.size_ = 0;
  operator_delete(pp_Var3);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0x20);
  local_88.last_ = pTVar2 + 1;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 3;
  pTVar2->data2 = 500;
  *(undefined8 *)&pTVar2->moved = 0x2bc00000258;
  local_88.first_ = pTVar2;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,&local_88,expected_00);
  operator_delete(pTVar2);
  lVar4 = -4;
  pTVar2 = local_68.first_;
  do {
    if (pTVar2 == (TestObject *)0x0) {
      __assert_fail("node_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                    ,0xa5,
                    "iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator++() [T = (anonymous namespace)::TestObject]"
                   );
    }
    pTVar2 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  local_38 = (GTestFlagSaver *)0x0;
  local_48.super_Test._vptr_Test = (_func_int **)0x0;
  local_48.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  pp_Var3 = (_func_int **)operator_new(4);
  local_48.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)((long)pp_Var3 + 4);
  *(undefined4 *)pp_Var3 = 400;
  local_48.super_Test._vptr_Test = pp_Var3;
  local_38 = local_48.super_Test.gtest_flag_saver_.ptr_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList(&local_88,&local_48,data_values_02);
  iVar5 = (int)&local_88;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_68,(int)&local_68,(__off64_t *)pTVar2,iVar5,(__off64_t *)&local_88,
             (size_t)local_88.first_,iVar5);
  pTVar2 = local_88.first_;
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  local_88.size_ = 0;
  operator_delete(pp_Var3);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0x24);
  local_88.last_ =
       (TestObject *)
       ((long)&pTVar2[1].super_intrusive_list_base<(anonymous_namespace)::TestObject>.next_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 400;
  pTVar2->data2 = 3;
  *(undefined1 **)&pTVar2->moved = &DAT_258000001f4;
  *(undefined4 *)&pTVar2[1].super_intrusive_list_base<(anonymous_namespace)::TestObject>.next_ = 700
  ;
  local_88.first_ = pTVar2;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,&local_88,expected_01);
  operator_delete(pTVar2);
  while (local_68.first_ != (TestObject *)0x0) {
    if ((local_68.first_)->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar2 = ((local_68.first_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_
    ;
    operator_delete(local_68.first_);
    local_68.first_ = pTVar2;
  }
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_list_move) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  list1.splice(list1.begin(), NewList({100, 200}));
  AssertListEq(list1, {100, 200, 1, 2, 3});

  // Splice at end.
  list1.splice(list1.end(), NewList({500, 600, 700}));
  AssertListEq(list1, {100, 200, 1, 2, 3, 500, 600, 700});

  // Splice in the middle.
  list1.splice(std::next(list1.begin(), 4), NewList({400}));
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 500, 600, 700});
}